

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
TasGrid::MultiIndexManipulations::getMaxIndexes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,MultiIndexSet *mset)

{
  uint uVar1;
  int iVar2;
  size_type __n;
  size_t sVar3;
  pointer piVar4;
  pointer piVar5;
  size_t j_1;
  ulong uVar6;
  size_type sVar7;
  ulong uVar8;
  vector<int,_std::allocator<int>_> local_max_index;
  allocator_type local_45;
  value_type_conflict3 local_44;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  __n = mset->num_dimensions;
  local_40._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,__n,
             (value_type_conflict3 *)&local_40,(allocator_type *)&local_44);
  uVar1 = mset->cache_num_indexes;
  local_44 = 0;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,__n,&local_44,&local_45);
  sVar3 = mset->num_dimensions;
  piVar5 = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar6;
  }
  for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
      if (*(int *)(CONCAT44(local_40._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_40._M_impl.super__Vector_impl_data._M_start._0_4_) + sVar7 * 4) <
          piVar5[sVar7]) {
        *(int *)(CONCAT44(local_40._M_impl.super__Vector_impl_data._M_start._4_4_,
                          local_40._M_impl.super__Vector_impl_data._M_start._0_4_) + sVar7 * 4) =
             piVar5[sVar7];
      }
    }
    piVar5 = piVar5 + sVar3;
  }
  piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
    iVar2 = *(int *)(CONCAT44(local_40._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_40._M_impl.super__Vector_impl_data._M_start._0_4_) + sVar7 * 4);
    if (piVar4[sVar7] < iVar2) {
      piVar4[sVar7] = iVar2;
    }
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> getMaxIndexes(const MultiIndexSet &mset){
    size_t num_dimensions = mset.getNumDimensions();
    std::vector<int> max_index(num_dimensions, 0);
    int n = mset.getNumIndexes();

    #pragma omp parallel
    {
        std::vector<int> local_max_index(num_dimensions, 0);
        #pragma omp for
        for(int i=0; i<n; i++){
            const int* p = mset.getIndex(i);
            for(size_t j=0; j<num_dimensions; j++) if (local_max_index[j] < p[j]) local_max_index[j] = p[j];
        }
        #pragma omp critical
        {
            for(size_t j=0; j<num_dimensions; j++){
                if (max_index[j] < local_max_index[j]) max_index[j] = local_max_index[j];
            }
        }
    }

    return max_index;
}